

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

String * kj::_::operator*(String *__return_storage_ptr__,undefined8 *param_2,undefined8 param_3,
                         undefined8 param_4,StringPtr *param_5)

{
  char *__s;
  StringPtr local_38;
  char *local_28;
  size_t local_20;
  
  __s = (char *)*param_2;
  local_20 = strlen(__s);
  local_38.content.ptr = (char *)param_2[2];
  local_38.content.size_ = param_2[3];
  local_28 = __s;
  concat<kj::ArrayPtr<char_const>,kj::StringPtr&,kj::StringPtr>
            (__return_storage_ptr__,(_ *)&local_28,(ArrayPtr<const_char> *)(param_2 + 4),&local_38,
             param_5);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}